

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O1

void __thiscall HACD::HACD::~HACD(HACD *this)

{
  Vec3<double> *pVVar1;
  ICHUll *pIVar2;
  HeapManager *pHVar3;
  Vec3<long> *pVVar4;
  pointer plVar5;
  long lVar6;
  
  pVVar1 = this->m_normals;
  if (pVVar1 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
  }
  pIVar2 = this->m_convexHulls;
  if (pIVar2 != (ICHUll *)0x0) {
    pHVar3 = pIVar2[-1].m_heapManager;
    if (pHVar3 != (HeapManager *)0x0) {
      lVar6 = (long)pHVar3 * 0x110;
      do {
        ICHUll::~ICHUll((ICHUll *)((long)(&pIVar2[-1].m_mesh.m_barycenter + -5) + lVar6));
        lVar6 = lVar6 + -0x110;
      } while (lVar6 != 0);
    }
    operator_delete__(&pIVar2[-1].m_heapManager,(long)pHVar3 * 0x110 | 8);
  }
  if (this->m_partition != (long *)0x0) {
    operator_delete__(this->m_partition);
  }
  pVVar1 = this->m_facePoints;
  if (pVVar1 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
  }
  pVVar1 = this->m_faceNormals;
  if (pVVar1 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
  }
  pVVar4 = this->m_trianglesDecimated;
  if (pVVar4 != (Vec3<long> *)0x0) {
    operator_delete__(pVVar4[-1].m_data + 2,pVVar4[-1].m_data[2] * 0x18 + 8);
  }
  pVVar1 = this->m_pointsDecimated;
  if (pVVar1 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
  }
  pVVar1 = this->m_extraDistPoints;
  if (pVVar1 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
  }
  pVVar1 = this->m_extraDistNormals;
  if (pVVar1 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar1[-1].m_data + 2,(long)pVVar1[-1].m_data[2] * 0x18 + 8);
  }
  Graph::~Graph(&this->m_graph);
  plVar5 = (this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar5 != (pointer)0x0) {
    operator_delete(plVar5,(long)(this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar5);
    return;
  }
  return;
}

Assistant:

HACD::~HACD(void)
	{
		delete [] m_normals;
        delete [] m_convexHulls;
		delete [] m_partition;
        delete [] m_facePoints;
        delete [] m_faceNormals;
        delete [] m_trianglesDecimated;
        delete [] m_pointsDecimated;
        delete [] m_extraDistPoints;
        delete [] m_extraDistNormals;
	}